

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HeapBlock.cpp
# Opt level: O3

void __thiscall
Memory::SmallHeapBlockT<MediumAllocationBlockAttributes>::TransferProcessedObjects
          (SmallHeapBlockT<MediumAllocationBlockAttributes> *this,FreeObject *list,FreeObject *tail)

{
  undefined4 *puVar1;
  code *pcVar2;
  byte *pbVar3;
  uint uVar4;
  byte bVar5;
  bool bVar6;
  FreeObject *this_00;
  FreeObject *this_01;
  uint i;
  undefined8 *in_FS_OFFSET;
  
  if (tail == (FreeObject *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar1 = (undefined4 *)*in_FS_OFFSET;
    *puVar1 = 1;
    bVar6 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/HeapBlock.cpp"
                       ,0x68b,"(tail != nullptr)","tail != nullptr");
    if (!bVar6) goto LAB_0020d91b;
    *puVar1 = 0;
  }
  if (list == (FreeObject *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar1 = (undefined4 *)*in_FS_OFFSET;
    *puVar1 = 1;
    bVar6 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/HeapBlock.cpp"
                       ,0x68c,"(list)","list");
    if (!bVar6) {
LAB_0020d91b:
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *puVar1 = 0;
    tail->taggedNext = 1;
  }
  else {
    tail->taggedNext = 1;
    puVar1 = (undefined4 *)*in_FS_OFFSET;
    this_01 = list;
    do {
      for (this_00 = this->freeObjectList; this_00 != (FreeObject *)0x0;
          this_00 = FreeObject::GetNext(this_00)) {
        if (this_00 == this_01) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          *puVar1 = 1;
          bVar6 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/HeapBlock.cpp"
                             ,0x693,"(!this->IsInFreeObjectList(freeObject))",
                             "!this->IsInFreeObjectList(freeObject)");
          if (!bVar6) goto LAB_0020d91b;
          *puVar1 = 0;
          break;
        }
      }
      if (((ulong)this_01 & 0xf) != 0) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        *puVar1 = 1;
        bVar6 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Recycler.inl"
                           ,0x24d,"(HeapInfo::IsAlignedAddress(objectAddress))",
                           "HeapInfo::IsAlignedAddress(objectAddress)");
        if (!bVar6) goto LAB_0020d91b;
        *puVar1 = 0;
      }
      uVar4 = (uint)((ulong)this_01 >> 4);
      i = uVar4 & 0x7ff;
      BVStatic<2048UL>::AssertRange(&this->debugFreeBits,i);
      pbVar3 = (byte *)((long)&(this->debugFreeBits).data[0].word + ((long)(int)i >> 3));
      uVar4 = uVar4 & 7;
      bVar5 = *pbVar3;
      *pbVar3 = *pbVar3 | '\x01' << uVar4;
      if ((bVar5 >> uVar4 & 1) != 0) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        *puVar1 = 1;
        bVar6 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/HeapBlock.cpp"
                           ,0x695,"(!isSet)","!isSet");
        if (!bVar6) goto LAB_0020d91b;
        *puVar1 = 0;
      }
      this_01 = FreeObject::GetNext(this_01);
    } while (this_01 != (FreeObject *)0x0);
  }
  FreeObject::SetNext(tail,this->freeObjectList);
  this->freeObjectList = list;
  CheckDebugFreeBitVector(this,true);
  return;
}

Assistant:

void
SmallHeapBlockT<TBlockAttributes>::TransferProcessedObjects(FreeObject * list, FreeObject * tail)
{
    Assert(tail != nullptr);
    Assert(list);
#if DBG || defined(RECYCLER_STATS)
    // make sure that object we are transferred to the free list are not freed yet
    tail->SetNext(nullptr);
    FreeObject * freeObject = list;
    while (freeObject != nullptr)
    {
        Assert(!this->IsInFreeObjectList(freeObject));
        BOOL isSet = this->GetDebugFreeBitVector()->TestAndSet(GetAddressBitIndex(freeObject));
        Assert(!isSet);
        freeObject = freeObject->GetNext();
    }
#endif
    tail->SetNext(this->freeObjectList);
    this->freeObjectList = list;

    RECYCLER_SLOW_CHECK(this->CheckDebugFreeBitVector(true));
}